

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.cc
# Opt level: O3

ASN1_OBJECT * OBJ_txt2obj(char *s,int no_name)

{
  int n;
  ASN1_OBJECT *pAVar1;
  
  if (no_name != 0) {
LAB_001aa6ec:
    pAVar1 = (ASN1_OBJECT *)create_object_with_text_oid((_func_int *)0x0,s,(char *)0x0,(char *)0x0);
    return pAVar1;
  }
  n = OBJ_sn2nid(s);
  if (n == 0) {
    n = OBJ_ln2nid(s);
    if (n == 0) goto LAB_001aa6ec;
  }
  pAVar1 = OBJ_nid2obj(n);
  return pAVar1;
}

Assistant:

ASN1_OBJECT *OBJ_txt2obj(const char *s, int dont_search_names) {
  if (!dont_search_names) {
    int nid = OBJ_sn2nid(s);
    if (nid == NID_undef) {
      nid = OBJ_ln2nid(s);
    }

    if (nid != NID_undef) {
      return OBJ_nid2obj(nid);
    }
  }

  return create_object_with_text_oid(NULL, s, NULL, NULL);
}